

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int decode_dec(BIGNUM *bn,char *in,int in_len)

{
  int iVar1;
  ulong local_38;
  BN_ULONG l;
  int local_28;
  int j;
  int i;
  int in_len_local;
  char *in_local;
  BIGNUM *bn_local;
  
  l._4_4_ = 0x13 - in_len % 0x13;
  if (l._4_4_ == 0x13) {
    l._4_4_ = 0;
  }
  local_38 = 0;
  local_28 = 0;
  do {
    if (in_len <= local_28) {
      return 1;
    }
    local_38 = (long)(in[local_28] + -0x30) + local_38 * 10;
    l._4_4_ = l._4_4_ + 1;
    if (l._4_4_ == 0x13) {
      iVar1 = BN_mul_word((BIGNUM *)bn,10000000000000000000);
      if ((iVar1 == 0) || (iVar1 = BN_add_word((BIGNUM *)bn,local_38), iVar1 == 0)) {
        return 0;
      }
      local_38 = 0;
      l._4_4_ = 0;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int decode_dec(BIGNUM *bn, const char *in, int in_len) {
  int i, j;
  BN_ULONG l = 0;

  // Decode |BN_DEC_NUM| digits at a time.
  j = BN_DEC_NUM - (in_len % BN_DEC_NUM);
  if (j == BN_DEC_NUM) {
    j = 0;
  }
  l = 0;
  for (i = 0; i < in_len; i++) {
    l *= 10;
    l += in[i] - '0';
    if (++j == BN_DEC_NUM) {
      if (!BN_mul_word(bn, BN_DEC_CONV) || !BN_add_word(bn, l)) {
        return 0;
      }
      l = 0;
      j = 0;
    }
  }
  return 1;
}